

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  undefined1 (*pauVar5) [32];
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar13 [32];
  float fVar17;
  undefined1 auVar14 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  auVar34 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar5 = (undefined1 (*) [32])(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    lVar8 = 0;
    for (iVar7 = 0; auVar33 = auVar34._0_16_, iVar7 + 7 < iVar6; iVar7 = iVar7 + 8) {
      auVar14 = *pauVar5;
      auVar13._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
      auVar13._8_4_ = auVar14._8_4_ ^ 0x80000000;
      auVar13._12_4_ = auVar14._12_4_ ^ 0x80000000;
      auVar13._16_4_ = auVar14._16_4_ ^ 0x80000000;
      auVar13._20_4_ = auVar14._20_4_ ^ 0x80000000;
      auVar13._24_4_ = auVar14._24_4_ ^ 0x80000000;
      auVar13._28_4_ = auVar14._28_4_ ^ 0x80000000;
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar26._16_4_ = 0x42b0c0a5;
      auVar26._20_4_ = 0x42b0c0a5;
      auVar26._24_4_ = 0x42b0c0a5;
      auVar26._28_4_ = 0x42b0c0a5;
      auVar14 = vminps_avx(auVar13,auVar26);
      auVar27._8_4_ = 0xc2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._12_4_ = 0xc2b0c0a5;
      auVar27._16_4_ = 0xc2b0c0a5;
      auVar27._20_4_ = 0xc2b0c0a5;
      auVar27._24_4_ = 0xc2b0c0a5;
      auVar27._28_4_ = 0xc2b0c0a5;
      auVar13 = vmaxps_avx(auVar14,auVar27);
      auVar28._0_4_ = auVar13._0_4_ * 1.442695 + 0.5;
      auVar28._4_4_ = auVar13._4_4_ * 1.442695 + 0.5;
      auVar28._8_4_ = auVar13._8_4_ * 1.442695 + 0.5;
      auVar28._12_4_ = auVar13._12_4_ * 1.442695 + 0.5;
      auVar28._16_4_ = auVar13._16_4_ * 1.442695 + 0.5;
      auVar28._20_4_ = auVar13._20_4_ * 1.442695 + 0.5;
      auVar28._24_4_ = auVar13._24_4_ * 1.442695 + 0.5;
      auVar28._28_4_ = 0x3ff8aa3b;
      auVar26 = vroundps_avx(auVar28,1);
      auVar14 = vcmpps_avx(auVar28,auVar26,1);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar32._16_4_ = 0x3f800000;
      auVar32._20_4_ = 0x3f800000;
      auVar32._24_4_ = 0x3f800000;
      auVar32._28_4_ = 0x3f800000;
      auVar14 = vandps_avx(auVar14,auVar32);
      auVar14 = vsubps_avx(auVar26,auVar14);
      fVar11 = auVar13._0_4_ + auVar14._0_4_ * -0.6931472;
      fVar15 = auVar13._4_4_ + auVar14._4_4_ * -0.6931472;
      fVar16 = auVar13._8_4_ + auVar14._8_4_ * -0.6931472;
      fVar17 = auVar13._12_4_ + auVar14._12_4_ * -0.6931472;
      fVar18 = auVar13._16_4_ + auVar14._16_4_ * -0.6931472;
      fVar19 = auVar13._20_4_ + auVar14._20_4_ * -0.6931472;
      fVar20 = auVar13._24_4_ + auVar14._24_4_ * -0.6931472;
      auVar21._0_4_ = (int)auVar14._0_4_;
      auVar21._4_4_ = (int)auVar14._4_4_;
      auVar21._8_4_ = (int)auVar14._8_4_;
      auVar21._12_4_ = (int)auVar14._12_4_;
      auVar29._16_4_ = (int)auVar14._16_4_;
      auVar29._0_16_ = auVar21;
      auVar29._20_4_ = (int)auVar14._20_4_;
      auVar29._24_4_ = (int)auVar14._24_4_;
      auVar29._28_4_ = (int)auVar14._28_4_;
      auVar30 = vpslld_avx(auVar21,0x17);
      auVar21 = vpslld_avx(auVar29._16_16_,0x17);
      auVar21 = vpaddd_avx(auVar21,auVar33);
      auVar33 = vpaddd_avx(auVar30,auVar33);
      auVar14._0_4_ =
           (fVar11 + 1.0 +
           fVar11 * fVar11 *
           (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
             0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar33._0_4_ + 1.0;
      auVar14._4_4_ =
           (fVar15 + 1.0 +
           fVar15 * fVar15 *
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar33._4_4_ + 1.0;
      auVar14._8_4_ =
           (fVar16 + 1.0 +
           fVar16 * fVar16 *
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar33._8_4_ + 1.0;
      auVar14._12_4_ =
           (fVar17 + 1.0 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar33._12_4_ + 1.0;
      auVar14._16_4_ =
           (fVar18 + 1.0 +
           fVar18 * fVar18 *
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar21._0_4_ + 1.0;
      auVar14._20_4_ =
           (fVar19 + 1.0 +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar21._4_4_ + 1.0;
      auVar14._24_4_ =
           (fVar20 + 1.0 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar21._8_4_ + 1.0;
      auVar14._28_4_ = auVar13._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar14 = vdivps_avx(auVar32,auVar14);
      *pauVar5 = auVar14;
      pauVar5 = pauVar5 + 1;
      lVar8 = lVar8 + 8;
    }
    for (; iVar7 + 3 < iVar6; iVar7 = iVar7 + 4) {
      auVar30._0_8_ = *(ulong *)*pauVar5 ^ 0x8000000080000000;
      auVar30._8_4_ = *(uint *)(*pauVar5 + 8) ^ 0x80000000;
      auVar30._12_4_ = *(uint *)(*pauVar5 + 0xc) ^ 0x80000000;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar30,auVar22);
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar12 = vmaxps_avx(auVar21,auVar23);
      auVar24._0_4_ = auVar12._0_4_ * 1.442695 + 0.5;
      auVar24._4_4_ = auVar12._4_4_ * 1.442695 + 0.5;
      auVar24._8_4_ = auVar12._8_4_ * 1.442695 + 0.5;
      auVar24._12_4_ = auVar12._12_4_ * 1.442695 + 0.5;
      auVar31._0_4_ = (int)auVar24._0_4_;
      auVar31._4_4_ = (int)auVar24._4_4_;
      auVar31._8_4_ = (int)auVar24._8_4_;
      auVar31._12_4_ = (int)auVar24._12_4_;
      auVar30 = vcvtdq2ps_avx(auVar31);
      auVar21 = vcmpps_avx(auVar24,auVar30,1);
      auVar21 = vandps_avx(auVar21,auVar33);
      auVar21 = vsubps_avx(auVar30,auVar21);
      fVar11 = auVar12._0_4_ + auVar21._0_4_ * -0.6931472;
      fVar15 = auVar12._4_4_ + auVar21._4_4_ * -0.6931472;
      fVar16 = auVar12._8_4_ + auVar21._8_4_ * -0.6931472;
      fVar17 = auVar12._12_4_ + auVar21._12_4_ * -0.6931472;
      auVar25._0_4_ = (int)auVar21._0_4_;
      auVar25._4_4_ = (int)auVar21._4_4_;
      auVar25._8_4_ = (int)auVar21._8_4_;
      auVar25._12_4_ = (int)auVar21._12_4_;
      auVar21 = vpslld_avx(auVar25,0x17);
      auVar21 = vpaddd_avx(auVar21,auVar33);
      auVar12._0_4_ =
           (fVar11 + auVar34._0_4_ +
           fVar11 * fVar11 *
           (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
             0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar21._0_4_ + auVar34._0_4_;
      auVar12._4_4_ =
           (fVar15 + auVar34._4_4_ +
           fVar15 * fVar15 *
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar21._4_4_ + auVar34._4_4_;
      auVar12._8_4_ =
           (fVar16 + auVar34._8_4_ +
           fVar16 * fVar16 *
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar21._8_4_ + auVar34._8_4_;
      auVar12._12_4_ =
           (fVar17 + auVar34._12_4_ +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar21._12_4_ + auVar34._12_4_;
      auVar21 = vdivps_avx(auVar33,auVar12);
      *(undefined1 (*) [16])*pauVar5 = auVar21;
      pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
      lVar8 = lVar8 + 4;
    }
    lVar4 = sVar3 * sVar2 * uVar10;
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      fVar11 = expf(-*(float *)((long)pvVar1 + lVar8 * 4 + lVar4));
      auVar34 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar1 + lVar8 * 4 + lVar4) = 1.0 / (fVar11 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}